

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O2

void __thiscall despot::log_ostream::log_ostream(log_ostream *this,ostream *out,string *marker)

{
  string local_50;
  
  std::ios::ios((ios *)&(this->super_ostream).field_0x98);
  (this->super_ostream)._vptr_basic_ostream = (_func_int **)0x19c2e8;
  *(undefined8 *)&(this->super_ostream).field_0x98 = 0x19c310;
  std::ostream::ostream(this,(streambuf *)&PTR_construction_vtable_24__0019c328);
  (this->super_ostream)._vptr_basic_ostream = (_func_int **)0x19c2e8;
  *(undefined8 *)&(this->super_ostream).field_0x98 = 0x19c310;
  std::__cxx11::string::string((string *)&local_50,(string *)marker);
  log_buf::log_buf((log_buf *)&(this->super_ostream).field_0x8,out,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

log_ostream::log_ostream(ostream& out, string marker) :
	ostream(&buffer_),
	buffer_(out, marker) {
}